

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

uint64_t msr_set_zone_clamped
                   (raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,int *cl_long,
                   int *cl_short)

{
  uint64_t uVar1;
  uint8_t first;
  uint8_t first_00;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x24c,
                  "uint64_t msr_set_zone_clamped(const raplcap_msr_ctx *, raplcap_zone, uint64_t, const int *, const int *)"
                 );
  }
  first_00 = '0';
  first = '\x10';
  if ((zone == RAPLCAP_ZONE_PSYS) && ((ctx->cpu_model | 0x40) == 0xcf)) {
    first_00 = '2';
    first = '\x12';
  }
  if (cl_long != (int *)0x0) {
    msrval = replace_bits(msrval,(ulong)(*cl_long != 0),first,first);
  }
  if ((cl_short != (int *)0x0) && (1 < ctx->cfg[zone].constraints)) {
    uVar1 = replace_bits(msrval,(ulong)(*cl_short != 0),first_00,first_00);
    return uVar1;
  }
  return msrval;
}

Assistant:

uint64_t msr_set_zone_clamped(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                              const int* cl_long, const int* cl_short) {
  assert(ctx != NULL);
  uint8_t cl1_bit = 16;
  uint8_t cl2_bit = 48;
  zone_clamped_quirks(ctx, zone, &cl1_bit, &cl2_bit);
  if (cl_long != NULL) {
    raplcap_log(DEBUG, "msr_set_zone_clamped: zone=%d, long_term: clamp=%d\n", zone, *cl_long);
    msrval = replace_bits(msrval, *cl_long ? 0x1 : 0x0, cl1_bit, cl1_bit);
  }
  if (cl_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    raplcap_log(DEBUG, "msr_set_zone_clamped: zone=%d, short_term: clamp=%d\n", zone, *cl_short);
    msrval = replace_bits(msrval, *cl_short ? 0x1 : 0x0, cl2_bit, cl2_bit);
  }
  return msrval;
}